

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O1

int mbedtls_ccm_setkey(mbedtls_ccm_context *ctx,mbedtls_cipher_id_t cipher,uchar *key,uint keybits)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info;
  
  cipher_info = mbedtls_cipher_info_from_values(cipher,keybits,MBEDTLS_MODE_ECB);
  iVar1 = -0xd;
  if ((cipher_info != (mbedtls_cipher_info_t *)0x0) && (cipher_info->block_size == 0x10)) {
    mbedtls_cipher_free(&ctx->cipher_ctx);
    iVar1 = mbedtls_cipher_setup(&ctx->cipher_ctx,cipher_info);
    if (iVar1 == 0) {
      iVar1 = mbedtls_cipher_setkey(&ctx->cipher_ctx,key,keybits,MBEDTLS_ENCRYPT);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ccm_setkey( mbedtls_ccm_context *ctx,
                        mbedtls_cipher_id_t cipher,
                        const unsigned char *key,
                        unsigned int keybits )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_cipher_info_t *cipher_info;

    CCM_VALIDATE_RET( ctx != NULL );
    CCM_VALIDATE_RET( key != NULL );

    cipher_info = mbedtls_cipher_info_from_values( cipher, keybits,
                                                   MBEDTLS_MODE_ECB );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    if( cipher_info->block_size != 16 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    mbedtls_cipher_free( &ctx->cipher_ctx );

    if( ( ret = mbedtls_cipher_setup( &ctx->cipher_ctx, cipher_info ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_setkey( &ctx->cipher_ctx, key, keybits,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        return( ret );
    }

    return( 0 );
}